

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)6>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int in_ECX;
  long in_RDX;
  uint *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  uint *puVar5;
  uint *end;
  int disty_2;
  int distx_2;
  int i_2;
  int len_2;
  uint *b_2;
  qreal fdw;
  qreal fdy_1;
  qreal fdx_1;
  _func_void_uint_ptr_uint_ptr_ushort_ptr_ushort_ptr_int_QTextureData_ptr_qreal_ptr_qreal_ptr_qreal_ptr_qreal_qreal_qreal
  *fetcher_2;
  int disty_1;
  int distx_1;
  int i_1;
  int len_1;
  uint *b_1;
  _func_void_uint_ptr_uint_ptr_int_QTextureData_ptr_int_int_int_int *fetcher_1;
  int distx;
  int i;
  int disty;
  int len;
  uint *b;
  _func_void_uint_ptr_uint_ptr_int_QTextureData_ptr_int_int_int_int *fetcher;
  int mid;
  int fdy;
  qreal cy;
  qreal cx;
  QList<unsigned_int> *clut;
  QPixelLayout *layout;
  qreal fw;
  qreal fy_1;
  qreal fx_1;
  int fy;
  int fx;
  int fdx;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2_2 [2048];
  uint buf1_2 [2048];
  uint buf2_1 [2048];
  uint buf1_1 [2048];
  uint buf2 [2048];
  uint buf1 [2048];
  uint in_stack_ffffffffffff2ef8;
  uint in_stack_ffffffffffff2efc;
  undefined4 in_stack_ffffffffffff2f00;
  undefined4 in_stack_ffffffffffff2f04;
  undefined4 in_stack_ffffffffffff2f08;
  int iVar6;
  undefined4 in_stack_ffffffffffff2f0c;
  qreal in_stack_ffffffffffff2f10;
  undefined8 in_stack_ffffffffffff2f18;
  QTextureData *in_stack_ffffffffffff2f20;
  undefined8 in_stack_ffffffffffff2f28;
  qreal fdw_00;
  uint *in_stack_ffffffffffff2f30;
  code *pcVar7;
  int in_stack_ffffffffffff2f38;
  int in_stack_ffffffffffff2f3c;
  undefined4 in_stack_ffffffffffff2f40;
  int iVar8;
  undefined4 in_stack_ffffffffffff2f44;
  undefined8 in_stack_ffffffffffff2f48;
  uint *puVar9;
  ushort *in_stack_ffffffffffff2f50;
  undefined4 in_stack_ffffffffffff2f58;
  undefined4 in_stack_ffffffffffff2f5c;
  undefined4 in_stack_ffffffffffff2f60;
  undefined4 in_stack_ffffffffffff2f64;
  uint *in_stack_ffffffffffff2f68;
  int *in_stack_ffffffffffff2f70;
  int in_stack_ffffffffffff2f78;
  QList<unsigned_int> *fx_00;
  QPixelLayout *fy_00;
  int local_d03c;
  double local_d038;
  double local_d030;
  double local_d028;
  int local_d020 [3];
  uint local_d014;
  int local_d010;
  int local_d00c;
  ushort local_d008 [1024];
  ushort local_c808 [1024];
  uint local_c008 [2048];
  uint local_a008 [1014];
  int in_stack_ffffffffffff6fd0;
  uint local_8008 [2048];
  uint local_6008 [2048];
  uint local_4008 [2048];
  uint local_2008 [2048];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fy_00 = qPixelLayouts + *(uint *)(in_RDX + 0xd0);
  fx_00 = *(QList<unsigned_int> **)(in_RDX + 0xd8);
  puVar5 = (uint *)((double)in_R8D + 0.5);
  end = (uint *)((double)in_ECX + 0.5);
  local_d00c = in_R9D;
  bVar1 = canUseFastMatrixPath
                    (in_stack_ffffffffffff2f10,
                     (qreal)CONCAT44(in_stack_ffffffffffff2f0c,in_stack_ffffffffffff2f08),
                     CONCAT44(in_stack_ffffffffffff2f04,in_stack_ffffffffffff2f00),
                     (QSpanData *)CONCAT44(in_stack_ffffffffffff2efc,in_stack_ffffffffffff2ef8));
  if (bVar1) {
    local_d010 = (int)(*(double *)(in_RDX + 0x38) * 65536.0);
    iVar2 = (int)(*(double *)(in_RDX + 0x40) * 65536.0);
    local_d014 = (int)((*(double *)(in_RDX + 0x50) * (double)end +
                        *(double *)(in_RDX + 0x38) * (double)puVar5 + *(double *)(in_RDX + 0x70)) *
                      65536.0) - 0x8000;
    local_d020[2] =
         (int)((*(double *)(in_RDX + 0x58) * (double)end +
                *(double *)(in_RDX + 0x40) * (double)puVar5 + *(double *)(in_RDX + 0x78)) * 65536.0)
         - 0x8000;
    puVar9 = in_RDI;
    if (iVar2 == 0) {
      iVar6 = qAbs<int>(&local_d010);
      iVar8 = (int)((ulong)in_RDX >> 0x20);
      if (iVar6 < 0x10001) {
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (puVar5,end,(QTextureData *)CONCAT44(iVar2,in_stack_ffffffffffff2f78),
                   in_stack_ffffffffffff2f70,(int *)in_stack_ffffffffffff2f68,iVar8,
                   in_stack_ffffffffffff6fd0);
      }
      else {
        iVar6 = qAbs<int>(&local_d010);
        if (iVar6 < 0x20001) {
          iVar6 = local_d00c;
          if (0x7ff < local_d00c * 2) {
            iVar6 = (local_d00c + 1) / 2;
          }
          fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                    (puVar5,end,(QTextureData *)CONCAT44(iVar2,iVar6),in_stack_ffffffffffff2f70,
                     (int *)in_stack_ffffffffffff2f68,iVar8,in_stack_ffffffffffff6fd0);
          if (iVar6 != local_d00c) {
            fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                      (puVar5,end,(QTextureData *)CONCAT44(iVar2,iVar6),in_stack_ffffffffffff2f70,
                       (int *)in_stack_ffffffffffff2f68,iVar8,in_stack_ffffffffffff6fd0);
          }
        }
        else {
          pcVar7 = 
          fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>;
          puVar5 = in_RDI;
          for (; local_d00c != 0; local_d00c = local_d00c - iVar2) {
            local_d020[1] = 0x400;
            piVar4 = qMin<int>(&local_d00c,local_d020 + 1);
            iVar2 = *piVar4;
            fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                      ((uint *)CONCAT44(in_stack_ffffffffffff2f3c,in_stack_ffffffffffff2f38),
                       in_stack_ffffffffffff2f30,(int)((ulong)in_stack_ffffffffffff2f28 >> 0x20),
                       in_stack_ffffffffffff2f20,(int)((ulong)in_stack_ffffffffffff2f18 >> 0x20),
                       (int)in_stack_ffffffffffff2f18,(int)pcVar7,in_stack_ffffffffffff2f78);
            (*fy_00->convertToARGB32PM)(local_2008,iVar2 << 1,fx_00);
            (*fy_00->convertToARGB32PM)(local_4008,iVar2 << 1,fx_00);
            for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
              uVar3 = interpolate_4_pixels
                                ((uint *)CONCAT44(in_stack_ffffffffffff2f0c,
                                                  in_stack_ffffffffffff2f08),
                                 (uint *)CONCAT44(in_stack_ffffffffffff2f04,
                                                  in_stack_ffffffffffff2f00),
                                 in_stack_ffffffffffff2efc,in_stack_ffffffffffff2ef8);
              puVar5[iVar6] = uVar3;
              local_d014 = local_d010 + local_d014;
            }
            puVar5 = puVar5 + iVar2;
          }
        }
      }
    }
    else {
      for (; local_d00c != 0; local_d00c = local_d00c - iVar6) {
        local_d020[0] = 0x400;
        piVar4 = qMin<int>(&local_d00c,local_d020);
        iVar6 = *piVar4;
        fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                  ((uint *)CONCAT44(in_stack_ffffffffffff2f3c,in_stack_ffffffffffff2f38),
                   in_stack_ffffffffffff2f30,(int)((ulong)in_stack_ffffffffffff2f28 >> 0x20),
                   in_stack_ffffffffffff2f20,(int)((ulong)in_stack_ffffffffffff2f18 >> 0x20),
                   (int)in_stack_ffffffffffff2f18,(int)in_stack_ffffffffffff2f70,
                   in_stack_ffffffffffff2f78);
        (*fy_00->convertToARGB32PM)(local_6008,iVar6 << 1,fx_00);
        (*fy_00->convertToARGB32PM)(local_8008,iVar6 << 1,fx_00);
        for (iVar8 = 0; iVar8 < iVar6; iVar8 = iVar8 + 1) {
          in_stack_ffffffffffff2f3c = (int)(local_d014 & 0xffff) >> 8;
          in_stack_ffffffffffff2f38 = (int)(local_d020[2] & 0xffffU) >> 8;
          uVar3 = interpolate_4_pixels
                            ((uint *)CONCAT44(in_stack_ffffffffffff2f0c,in_stack_ffffffffffff2f08),
                             (uint *)CONCAT44(in_stack_ffffffffffff2f04,in_stack_ffffffffffff2f00),
                             in_stack_ffffffffffff2efc,in_stack_ffffffffffff2ef8);
          puVar9[iVar8] = uVar3;
          local_d014 = local_d010 + local_d014;
          local_d020[2] = iVar2 + local_d020[2];
        }
        puVar9 = puVar9 + iVar6;
      }
    }
  }
  else {
    pcVar7 = 
    fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>;
    fdw_00 = *(qreal *)(in_RDX + 0x38);
    local_d028 = *(double *)(in_RDX + 0x50) * (double)end +
                 *(double *)(in_RDX + 0x38) * (double)puVar5 + *(double *)(in_RDX + 0x70);
    local_d030 = *(double *)(in_RDX + 0x58) * (double)end +
                 *(double *)(in_RDX + 0x40) * (double)puVar5 + *(double *)(in_RDX + 0x78);
    local_d038 = *(double *)(in_RDX + 0x60) * (double)end +
                 *(double *)(in_RDX + 0x48) * (double)puVar5 + *(double *)(in_RDX + 0x68);
    puVar5 = in_RDI;
    for (; local_d00c != 0; local_d00c = local_d00c - iVar2) {
      local_d03c = 0x400;
      piVar4 = qMin<int>(&local_d00c,&local_d03c);
      iVar2 = *piVar4;
      fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
                (in_stack_ffffffffffff2f68,
                 (uint *)CONCAT44(in_stack_ffffffffffff2f64,in_stack_ffffffffffff2f60),
                 (ushort *)CONCAT44(in_stack_ffffffffffff2f5c,in_stack_ffffffffffff2f58),
                 in_stack_ffffffffffff2f50,(int)((ulong)in_stack_ffffffffffff2f48 >> 0x20),
                 (QTextureData *)CONCAT44(in_stack_ffffffffffff2f44,in_stack_ffffffffffff2f40),
                 (qreal *)fx_00,(qreal *)fy_00,(qreal *)CONCAT44(in_ECX,in_R8D),
                 (qreal)CONCAT44(in_stack_ffffffffffff2f3c,in_stack_ffffffffffff2f38),(qreal)pcVar7,
                 fdw_00);
      (*fy_00->convertToARGB32PM)(local_a008,iVar2 << 1,fx_00);
      (*fy_00->convertToARGB32PM)(local_c008,iVar2 << 1,fx_00);
      for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
        uVar3 = interpolate_4_pixels
                          ((uint *)CONCAT44(iVar2,iVar6),
                           (uint *)CONCAT44((int)(uint)local_c808[iVar6] >> 8,
                                            (int)(uint)local_d008[iVar6] >> 8),
                           in_stack_ffffffffffff2efc,in_stack_ffffffffffff2ef8);
        puVar5[iVar6] = uVar3;
      }
      puVar5 = puVar5 + iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}